

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

NodePtr __thiscall dh::analysis::var_decl(analysis *this)

{
  undefined1 *puVar1;
  int iVar2;
  ostream *poVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  analysis *in_RSI;
  NodePtr NVar5;
  NodePtr tmp_ptr;
  undefined1 local_f9;
  undefined1 local_f8 [40];
  undefined1 local_d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  char local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  token::getVal_abi_cxx11_
            ((string *)local_f8,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_f8._36_4_ =
       token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  this->layer_record = 0;
  this->initFlag = false;
  *(undefined3 *)&this->field_0x5 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,std::__cxx11::string,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->current_tab,(TreeNode **)this,
             (allocator<dh::TreeNode> *)&local_f9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
             (int *)(local_f8 + 0x24));
  puVar1 = local_f8 + 0x10;
  if ((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_) != puVar1) {
    operator_delete((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_));
  }
  token::getVal_abi_cxx11_
            ((string *)local_f8,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iVar2 = std::__cxx11::string::compare(local_f8);
  if ((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_) != puVar1) {
    operator_delete((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_));
  }
  if (iVar2 == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"int","");
    match(in_RSI,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_f8._0_4_ = 2;
    TreeNode::setType(*(TreeNode **)this,(int *)local_f8);
  }
  else {
    token::getVal_abi_cxx11_
              ((string *)local_f8,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar2 = std::__cxx11::string::compare(local_f8);
    if ((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_) != puVar1) {
      operator_delete((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_));
    }
    if (iVar2 == 0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"boolean","");
      match(in_RSI,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      local_f8._0_4_ = 0;
      TreeNode::setType(*(TreeNode **)this,(int *)local_f8);
    }
    else {
      token::getVal_abi_cxx11_
                ((string *)local_f8,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      iVar2 = std::__cxx11::string::compare(local_f8);
      if ((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_) != puVar1) {
        operator_delete((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_));
      }
      if (iVar2 == 0) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"float","");
        match(in_RSI,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        local_f8._0_4_ = 3;
        TreeNode::setType(*(TreeNode **)this,(int *)local_f8);
      }
      else {
        token::getVal_abi_cxx11_
                  ((string *)local_f8,
                   (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        iVar2 = std::__cxx11::string::compare(local_f8);
        if ((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_) != puVar1) {
          operator_delete((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_));
        }
        if (iVar2 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"[ERROR] Unexpected type \"",0x19);
          token::getVal_abi_cxx11_
                    ((string *)local_f8,
                     (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)CONCAT44(local_f8._4_4_,local_f8._0_4_),
                              local_f8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" in line ",10);
          iVar2 = token::getLineno((in_RSI->tmp).
                                   super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::string::~string((string *)local_f8);
          exit(1);
        }
        local_b0._M_allocated_capacity = (size_type)local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"void","");
        match(in_RSI,(string *)&local_b0);
        if ((char *)local_b0._M_allocated_capacity != local_a0) {
          operator_delete((void *)local_b0._M_allocated_capacity);
        }
        local_f8._0_4_ = 4;
        TreeNode::setType(*(TreeNode **)this,(int *)local_f8);
      }
    }
  }
  local_f8._0_4_ = 0;
  TreeNode::setNodeKind(*(TreeNode **)this,(int *)local_f8);
  local_f8._0_4_ = 1;
  TreeNode::setKind(*(TreeNode **)this,(int *)local_f8);
  init_declarator_list((analysis *)local_f8);
  TreeNode::appendChild(*(TreeNode **)this,(NodePtr *)local_f8);
  local_d0._0_8_ = (pointer)(local_d0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,";","");
  match(in_RSI,(string *)local_d0);
  _Var4._M_pi = extraout_RDX;
  if ((pointer)local_d0._0_8_ != (pointer)(local_d0 + 0x10)) {
    operator_delete((void *)local_d0._0_8_);
    _Var4._M_pi = extraout_RDX_00;
  }
  if ((element_type *)local_f8._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    _Var4._M_pi = extraout_RDX_01;
  }
  NVar5.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi
  ;
  NVar5.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar5.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::var_decl()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in var_decl\n";
#endif
	NodePtr ret = ::std::make_shared<TreeNode>(tmp->getVal(), tmp->getLineno());
	if ( tmp->getVal() == "int")
	{
		match("int");
		ret->setType(TypeKind::IntK);
	} else if ( tmp->getVal() == "boolean")
	{
		match("boolean");
		ret->setType(TypeKind::BoolK);
	} else if ( tmp->getVal() == "float")
	{
		match("float");
		ret->setType(TypeKind::FloatK);
	} else if ( tmp->getVal() == "void")
	{
		match("void");
		ret->setType(TypeKind::VoidK);
	} else 
	{
		::std::cerr << "[ERROR] Unexpected type \""
			<< tmp->getVal()
			<< "\" in line "
			<< tmp->getLineno()
			<< ::std::endl;
		::std::exit(1);
	}
	ret->setNodeKind(NodeKind::DeclK);
	ret->setKind(DeclKind::VarK);

	NodePtr tmp_ptr = init_declarator_list();
	ret->appendChild(tmp_ptr);

	match(";");

	return ret;
}